

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

int * __thiscall
cs::mapping<cs::signal_types,_int>::match(mapping<cs::signal_types,_int> *this,signal_types *k)

{
  bool bVar1;
  compile_error *this_00;
  mapped_type_conflict *pmVar2;
  string *in_stack_ffffffffffffff98;
  mapping<cs::signal_types,_int> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  map<cs::signal_types,_int,_std::less<cs::signal_types>,_std::allocator<std::pair<const_cs::signal_types,_int>_>_>
  *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = exist(in_stack_ffffffffffffffa0,(signal_types *)in_stack_ffffffffffffff98);
  if (!bVar1) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Undefined Mapping.",&local_31);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pmVar2 = std::
           map<cs::signal_types,_int,_std::less<cs::signal_types>,_std::allocator<std::pair<const_cs::signal_types,_int>_>_>
           ::at(in_stack_ffffffffffffffc0,
                (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return pmVar2;
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}